

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atari8k.hpp
# Opt level: O2

void __thiscall
Atari2600::Cartridge::Atari8k::perform_bus_operation
          (Atari8k *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  ushort uVar1;
  uint8_t *puVar2;
  
  uVar1 = address & 0x1fff;
  if (uVar1 < 0x1000) {
    return;
  }
  if (uVar1 == 0x1ff9) {
    puVar2 = (this->super_BusExtender).rom_base_ + 0x1000;
  }
  else {
    if (uVar1 != 0x1ff8) goto LAB_002c6a70;
    puVar2 = (this->super_BusExtender).rom_base_;
  }
  this->rom_ptr_ = puVar2;
LAB_002c6a70:
  if ((int)operation < 5) {
    *value = this->rom_ptr_[address & 0xfff];
  }
  return;
}

Assistant:

void perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			address &= 0x1fff;
			if(!(address & 0x1000)) return;

			if(address == 0x1ff8) rom_ptr_ = rom_base_;
			else if(address == 0x1ff9) rom_ptr_ = rom_base_ + 4096;

			if(isReadOperation(operation)) {
				*value = rom_ptr_[address & 4095];
			}
		}